

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int execSql(sqlite3 *db,char **pzErrMsg,char *zSql)

{
  int iVar1;
  sqlite3 *in_RDX;
  sqlite3 *in_RSI;
  char **in_RDI;
  char *zSubSql;
  int rc;
  sqlite3_stmt *pStmt;
  undefined8 in_stack_ffffffffffffffb8;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  sqlite3_stmt *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = sqlite3_prepare_v2(in_RDX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               (sqlite3_stmt **)in_stack_ffffffffffffffc8,
                               (char **)in_stack_ffffffffffffffc0);
  if (local_4 == 0) {
    do {
      local_4 = sqlite3_step((sqlite3_stmt *)in_RSI);
      if (local_4 != 100) break;
      in_stack_ffffffffffffffc8 =
           (sqlite3_stmt *)
           sqlite3_column_text(in_stack_ffffffffffffffc0,
                               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    } while ((in_stack_ffffffffffffffc8 == (sqlite3_stmt *)0x0) ||
            (((iVar1 = strncmp((char *)in_stack_ffffffffffffffc8,"CRE",3), iVar1 != 0 &&
              (iVar1 = strncmp((char *)in_stack_ffffffffffffffc8,"INS",3), iVar1 != 0)) ||
             (local_4 = execSql(in_RSI,(char **)in_RDX,in_stack_ffffffffffffffd8), local_4 == 0))));
    if (local_4 == 0x65) {
      local_4 = 0;
    }
    if (local_4 != 0) {
      sqlite3_errmsg(in_RSI);
      sqlite3SetString(in_RDI,in_RSI,(char *)0x17d62f);
    }
    sqlite3_finalize(in_stack_ffffffffffffffc8);
  }
  return local_4;
}

Assistant:

static int execSql(sqlite3 *db, char **pzErrMsg, const char *zSql){
  sqlite3_stmt *pStmt;
  int rc;

  /* printf("SQL: [%s]\n", zSql); fflush(stdout); */
  rc = sqlite3_prepare_v2(db, zSql, -1, &pStmt, 0);
  if( rc!=SQLITE_OK ) return rc;
  while( SQLITE_ROW==(rc = sqlite3_step(pStmt)) ){
    const char *zSubSql = (const char*)sqlite3_column_text(pStmt,0);
    assert( sqlite3_strnicmp(zSql,"SELECT",6)==0 );
    /* The secondary SQL must be one of CREATE TABLE, CREATE INDEX,
    ** or INSERT.  Historically there have been attacks that first
    ** corrupt the sqlite_master.sql field with other kinds of statements
    ** then run VACUUM to get those statements to execute at inappropriate
    ** times. */
    if( zSubSql
     && (strncmp(zSubSql,"CRE",3)==0 || strncmp(zSubSql,"INS",3)==0)
    ){
      rc = execSql(db, pzErrMsg, zSubSql);
      if( rc!=SQLITE_OK ) break;
    }
  }
  assert( rc!=SQLITE_ROW );
  if( rc==SQLITE_DONE ) rc = SQLITE_OK;
  if( rc ){
    sqlite3SetString(pzErrMsg, db, sqlite3_errmsg(db));
  }
  (void)sqlite3_finalize(pStmt);
  return rc;
}